

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::UnaryExpr<bool>::streamReconstructedExpression(UnaryExpr<bool> *this,ostream *os)

{
  ulong uVar1;
  char *pcVar2;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  uVar1 = (ulong)(byte)(this->super_ITransientExpression).field_0xa;
  pcVar2 = "false";
  if (uVar1 != 0) {
    pcVar2 = "true";
  }
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,pcVar2,pcVar2 + (uVar1 ^ 5));
  std::__ostream_insert<char,std::char_traits<char>>(os,local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }